

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O1

size_t EC_get_builtin_curves(EC_builtin_curve *r,size_t nitems)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  
  sVar2 = 4;
  if (nitems < 4) {
    sVar2 = nitems;
  }
  if (nitems != 0) {
    lVar3 = 0;
    do {
      lVar1 = (**(code **)((long)kAllGroups + lVar3))();
      *(undefined4 *)((long)&r->nid + lVar3 * 2) = *(undefined4 *)(lVar1 + 0x200);
      *(undefined8 *)((long)&r->comment + lVar3 * 2) = *(undefined8 *)(lVar1 + 0x1f8);
      lVar3 = lVar3 + 8;
    } while (sVar2 * 8 != lVar3);
  }
  return 4;
}

Assistant:

size_t EC_get_builtin_curves(EC_builtin_curve *out_curves,
                             size_t max_num_curves) {
  if (max_num_curves > OPENSSL_ARRAY_SIZE(kAllGroups)) {
    max_num_curves = OPENSSL_ARRAY_SIZE(kAllGroups);
  }
  for (size_t i = 0; i < max_num_curves; i++) {
    const EC_GROUP *group = kAllGroups[i]();
    out_curves[i].nid = group->curve_name;
    out_curves[i].comment = group->comment;
  }
  return OPENSSL_ARRAY_SIZE(kAllGroups);
}